

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::UniformAssignCase::UniformAssignCase
          (UniformAssignCase *this,Context *context,char *name,char *description,
          CaseShaderType shaderType,
          SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
          *uniformCollection,CheckMethod checkMethod,AssignMethod assignMethod,
          deUint32 additionalFeatures)

{
  uint uVar1;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
  *uniformCollection_local;
  CaseShaderType shaderType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  UniformAssignCase *this_local;
  
  uVar1 = 0;
  if (assignMethod == ASSIGNMETHOD_VALUE) {
    uVar1 = 2;
  }
  UniformCase::UniformCase
            (&this->super_UniformCase,context,name,description,shaderType,uniformCollection,
             uVar1 | additionalFeatures);
  (this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformAssignCase_032c98d8;
  this->m_checkMethod = checkMethod;
  return;
}

Assistant:

UniformAssignCase::UniformAssignCase (Context&									context,
									  const char* const							name,
									  const char* const							description,
									  const CaseShaderType						shaderType,
									  const SharedPtr<const UniformCollection>&	uniformCollection,
									  const CheckMethod							checkMethod,
									  const AssignMethod						assignMethod,
									  const deUint32							additionalFeatures)
	: UniformCase		(context, name, description, shaderType, uniformCollection,
						 (assignMethod == ASSIGNMETHOD_VALUE ? FEATURE_UNIFORMFUNC_VALUE : 0) | additionalFeatures)
	, m_checkMethod		(checkMethod)
{
	DE_ASSERT(assignMethod != ASSIGNMETHOD_LAST);
}